

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParsePatterns(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes,int group)

{
  xmlRelaxNGDefinePtr pxVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  int iVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlRelaxNGDefinePtr_conflict pxVar5;
  xmlRelaxNGDefinePtr_conflict parent;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict last;
  xmlRelaxNGDefinePtr_conflict def;
  _xmlNode *p_Stack_20;
  int group_local;
  xmlNodePtr nodes_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  last = (xmlRelaxNGDefinePtr_conflict)0x0;
  cur = (xmlRelaxNGDefinePtr_conflict)0x0;
  pxVar1 = ctxt->def;
  p_Stack_20 = nodes;
  do {
    if (p_Stack_20 == (xmlNodePtr)0x0) {
      return last;
    }
    if ((((p_Stack_20 == (xmlNodePtr)0x0) || (p_Stack_20->ns == (xmlNs *)0x0)) ||
        (p_Stack_20->type != XML_ELEMENT_NODE)) ||
       ((iVar3 = xmlStrEqual(p_Stack_20->name,"element"), iVar3 == 0 ||
        (iVar3 = xmlStrEqual(p_Stack_20->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
      pxVar5 = xmlRelaxNGParsePattern(ctxt,p_Stack_20);
      pxVar4 = cur;
      pxVar2 = last;
      if ((pxVar5 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
         (pxVar4 = pxVar5, pxVar2 = pxVar5, last != (xmlRelaxNGDefinePtr_conflict)0x0)) {
        cur->next = pxVar5;
        pxVar2 = last;
      }
    }
    else {
      pxVar4 = xmlRelaxNGParseElement(ctxt,p_Stack_20);
      if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar2 = pxVar4;
      if (last != (xmlRelaxNGDefinePtr_conflict)0x0) {
        if (((group == 1) && (last->type == XML_RELAXNG_ELEMENT)) && (last == cur)) {
          last = xmlRelaxNGNewDefine(ctxt,p_Stack_20);
          if (last == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          last->type = XML_RELAXNG_GROUP;
          last->content = cur;
        }
        cur->next = pxVar4;
        pxVar2 = last;
      }
      last = pxVar2;
      pxVar4->parent = pxVar1;
      pxVar2 = last;
    }
    last = pxVar2;
    cur = pxVar4;
    p_Stack_20 = p_Stack_20->next;
  } while( true );
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePatterns(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes,
                        int group)
{
    xmlRelaxNGDefinePtr def = NULL, last = NULL, cur, parent;

    parent = ctxt->def;
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "element")) {
            cur = xmlRelaxNGParseElement(ctxt, nodes);
            if (cur == NULL)
                return (NULL);
            if (def == NULL) {
                def = last = cur;
            } else {
                if ((group == 1) && (def->type == XML_RELAXNG_ELEMENT) &&
                    (def == last)) {
                    def = xmlRelaxNGNewDefine(ctxt, nodes);
                    if (def == NULL)
                        return (NULL);
                    def->type = XML_RELAXNG_GROUP;
                    def->content = last;
                }
                last->next = cur;
                last = cur;
            }
            cur->parent = parent;
        } else {
            cur = xmlRelaxNGParsePattern(ctxt, nodes);
            if (cur != NULL) {
                if (def == NULL) {
                    def = last = cur;
                } else {
                    last->next = cur;
                    last = cur;
                }
            }
        }
        nodes = nodes->next;
    }
    return (def);
}